

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void setOutputFile(QString *file,QString *format)

{
  QAnyStringView s;
  bool bVar1;
  QString *pQVar2;
  QAnyStringView *in_RSI;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QAnyStringView QVar4;
  ArgBase *argBases [2];
  QString *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  undefined1 uVar5;
  QAnyStringView *this;
  QLatin1String *local_130;
  QFileInfo local_e8 [32];
  QLatin1StringView local_c8;
  undefined1 local_b8 [54];
  QChar local_82 [9];
  undefined1 local_70 [24];
  qsizetype local_58;
  char *local_50;
  size_t local_48;
  ulong local_40;
  size_t local_38;
  ulong local_30;
  size_t local_28;
  ulong local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RSI;
  bVar1 = QString::isEmpty((QString *)0x10e31e);
  if (bVar1) {
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RSI,CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0))
    ;
    local_130 = (QLatin1String *)QVar3.m_size;
    QString::operator=((QString *)this,local_130);
  }
  bVar1 = QString::isEmpty((QString *)0x10e35d);
  uVar5 = true;
  if (!bVar1) {
    QChar::QChar<char16_t,_true>(local_82,L'-');
    uVar5 = operator==((QString *)CONCAT17(uVar5,in_stack_fffffffffffffeb0),
                       (QChar *)in_stack_fffffffffffffea8);
  }
  if ((bool)uVar5 == false) {
    pQVar2 = QHash<QString,_QString>::operator[]
                       ((QHash<QString,_QString> *)in_RDI.m_data,(QString *)in_RSI);
    QString::operator=(pQVar2,(QString *)in_RDI.m_data);
  }
  else {
    bVar1 = QHash<QString,_QString>::contains
                      ((QHash<QString,_QString> *)in_RSI,
                       (QString *)CONCAT17(uVar5,in_stack_fffffffffffffeb0));
    if (bVar1) {
      QHash<QString,_QString>::value((QHash<QString,_QString> *)this,(QString *)in_RDI.m_data);
      QString::operator=((QString *)CONCAT17(uVar5,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffea8);
      QString::~QString((QString *)0x10e3fc);
    }
    else {
      local_c8 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_RSI,CONCAT17(uVar5,in_stack_fffffffffffffeb0));
      local_58 = local_c8.m_size;
      local_50 = local_c8.m_data;
      QVar3.m_data = (char *)this;
      QVar3.m_size = (qsizetype)in_RDI.m_data;
      QAnyStringView::QAnyStringView(in_RSI,QVar3);
      QAnyStringView::QAnyStringView((QAnyStringView *)in_RDI.m_data,(QString *)in_RSI);
      s.m_size = (size_t)this;
      s.field_0.m_data = in_RDI.m_data;
      QtPrivate::qStringLikeToArg(s);
      local_28 = local_48;
      local_20 = local_40;
      local_18 = local_70;
      local_10 = 0;
      local_38 = local_48;
      local_30 = local_40;
      QVar4.m_size = local_48;
      QVar4.field_0.m_data = local_b8;
      QtPrivate::argToQString(QVar4,local_40,(ArgBase **)0x1);
      QString::operator=((QString *)CONCAT17(uVar5,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffea8);
      QString::~QString((QString *)0x10e58b);
      pQVar2 = QHash<QString,_QString>::operator[]
                         ((QHash<QString,_QString> *)in_RDI.m_data,(QString *)in_RSI);
      QString::operator=(pQVar2,(QString *)in_RDI.m_data);
    }
    QFileInfo::QFileInfo(local_e8,(QString *)in_RDI.m_data);
    QFileInfo::fileName();
    QString::operator=((QString *)CONCAT17(uVar5,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffea8);
    QString::~QString((QString *)0x10e5f0);
    QFileInfo::~QFileInfo(local_e8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void setOutputFile(QString file, QString format)
{
    if (format.isEmpty())
        format = "txt"_L1;

    if ((file.isEmpty() || file == u'-')) {
        if (g_options.outFiles.contains(format)) {
            file = g_options.outFiles.value(format);
        } else {
            file = "stdout.%1"_L1.arg(format);
            g_options.outFiles[format] = file;
        }
        g_options.stdoutFileName = QFileInfo(file).fileName();
    } else {
        g_options.outFiles[format] = file;
    }
}